

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  once_flag *__once;
  long lVar1;
  bool bVar2;
  int iVar3;
  FieldGeneratorBase *pFVar4;
  Descriptor *pDVar5;
  PrimitiveFieldGenerator *this;
  WrapperFieldGenerator *this_00;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),&local_28,&local_30);
  }
  if ((byte)descriptor[2] - 10 < 2) {
    __once = *(once_flag **)(descriptor + 0x18);
    if ((~(byte)descriptor[1] & 0x60) == 0) {
      if (__once != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_30 = descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_28,&local_30);
      }
      if ((descriptor[2] == (FieldDescriptor)0xb) &&
         (bVar2 = FieldDescriptor::is_map_message_type(descriptor), bVar2)) {
        pFVar4 = (FieldGeneratorBase *)operator_new(0x50);
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)pFVar4,descriptor,presenceIndex,options);
        return pFVar4;
      }
      this = (PrimitiveFieldGenerator *)operator_new(0x50);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)this,descriptor,presenceIndex,options);
    }
    else {
      if (__once != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_30 = descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_28,&local_30);
      }
      if (descriptor[2] == (FieldDescriptor)0xb) {
        pDVar5 = FieldDescriptor::message_type(descriptor);
        iVar3 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar5 + 0x10));
        if (iVar3 == 0) {
          lVar1 = *(long *)(descriptor + 0x28);
          if ((lVar1 != 0 && ((byte)descriptor[1] & 0x10) != 0) &&
             ((*(int *)(lVar1 + 4) != 1 ||
              (lVar1 != 0 && (*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))) {
            pFVar4 = (FieldGeneratorBase *)operator_new(0x58);
            WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                      ((WrapperOneofFieldGenerator *)pFVar4,descriptor,presenceIndex,options);
            return pFVar4;
          }
          this_00 = (WrapperFieldGenerator *)operator_new(0x58);
          WrapperFieldGenerator::WrapperFieldGenerator(this_00,descriptor,presenceIndex,options);
          return &this_00->super_FieldGeneratorBase;
        }
      }
      lVar1 = *(long *)(descriptor + 0x28);
      if ((lVar1 == 0 || ((byte)descriptor[1] & 0x10) == 0) ||
         ((*(int *)(lVar1 + 4) == 1 &&
          (lVar1 == 0 || (*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
        this = (PrimitiveFieldGenerator *)operator_new(0x50);
        MessageFieldGenerator::MessageFieldGenerator
                  ((MessageFieldGenerator *)this,descriptor,presenceIndex,options);
      }
      else {
        this = (PrimitiveFieldGenerator *)operator_new(0x50);
        MessageOneofFieldGenerator::MessageOneofFieldGenerator
                  ((MessageOneofFieldGenerator *)this,descriptor,presenceIndex,options);
      }
    }
  }
  else if (descriptor[2] == (FieldDescriptor)0xe) {
    if ((~(byte)descriptor[1] & 0x60) == 0) {
      this = (PrimitiveFieldGenerator *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,descriptor,presenceIndex,options);
    }
    else {
      lVar1 = *(long *)(descriptor + 0x28);
      if ((lVar1 == 0 || ((byte)descriptor[1] & 0x10) == 0) ||
         ((*(int *)(lVar1 + 4) == 1 &&
          (lVar1 == 0 || (*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
        this = (PrimitiveFieldGenerator *)operator_new(0x58);
        EnumFieldGenerator::EnumFieldGenerator
                  ((EnumFieldGenerator *)this,descriptor,presenceIndex,options);
      }
      else {
        this = (PrimitiveFieldGenerator *)operator_new(0x58);
        EnumOneofFieldGenerator::EnumOneofFieldGenerator
                  ((EnumOneofFieldGenerator *)this,descriptor,presenceIndex,options);
      }
    }
  }
  else if ((~(byte)descriptor[1] & 0x60) == 0) {
    this = (PrimitiveFieldGenerator *)operator_new(0x50);
    RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
              ((RepeatedPrimitiveFieldGenerator *)this,descriptor,presenceIndex,options);
  }
  else {
    lVar1 = *(long *)(descriptor + 0x28);
    if ((lVar1 == 0 || ((byte)descriptor[1] & 0x10) == 0) ||
       ((*(int *)(lVar1 + 4) == 1 &&
        (lVar1 == 0 || (*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
      this = (PrimitiveFieldGenerator *)operator_new(0x58);
      PrimitiveFieldGenerator::PrimitiveFieldGenerator(this,descriptor,presenceIndex,options);
    }
    else {
      this = (PrimitiveFieldGenerator *)operator_new(0x58);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)this,descriptor,presenceIndex,options);
    }
  }
  return &this->super_FieldGeneratorBase;
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex, options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex, options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex, options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex, options);
        }
      }
  }
}